

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O2

void __thiscall
cfd::core::DescriptorKeyInfo::DescriptorKeyInfo(DescriptorKeyInfo *this,DescriptorKeyInfo *object)

{
  SchnorrPubkey::SchnorrPubkey(&this->schnorr_pubkey_);
  Pubkey::Pubkey(&this->pubkey_);
  Privkey::Privkey(&this->privkey_);
  ExtPrivkey::ExtPrivkey(&this->extprivkey_);
  ExtPubkey::ExtPubkey(&this->extpubkey_);
  (this->parent_info_)._M_dataplus._M_p = (pointer)&(this->parent_info_).field_2;
  (this->parent_info_)._M_string_length = 0;
  (this->parent_info_).field_2._M_local_buf[0] = '\0';
  (this->path_)._M_dataplus._M_p = (pointer)&(this->path_).field_2;
  (this->path_)._M_string_length = 0;
  (this->path_).field_2._M_local_buf[0] = '\0';
  (this->key_string_)._M_dataplus._M_p = (pointer)&(this->key_string_).field_2;
  (this->key_string_)._M_string_length = 0;
  (this->key_string_).field_2._M_local_buf[0] = '\0';
  this->key_type_ = object->key_type_;
  ByteData::operator=(&(this->pubkey_).data_,&(object->pubkey_).data_);
  ByteData256::operator=(&(this->schnorr_pubkey_).data_,&(object->schnorr_pubkey_).data_);
  Privkey::operator=(&this->privkey_,&object->privkey_);
  Extkey::operator=(&(this->extprivkey_).super_Extkey,&(object->extprivkey_).super_Extkey);
  Extkey::operator=(&(this->extpubkey_).super_Extkey,&(object->extpubkey_).super_Extkey);
  ::std::__cxx11::string::_M_assign((string *)&this->parent_info_);
  ::std::__cxx11::string::_M_assign((string *)&this->path_);
  ::std::__cxx11::string::_M_assign((string *)&this->key_string_);
  return;
}

Assistant:

DescriptorKeyInfo::DescriptorKeyInfo(const DescriptorKeyInfo& object) {
  key_type_ = object.key_type_;
  pubkey_ = object.pubkey_;
  schnorr_pubkey_ = object.schnorr_pubkey_;
  privkey_ = object.privkey_;
  extprivkey_ = object.extprivkey_;
  extpubkey_ = object.extpubkey_;
  parent_info_ = object.parent_info_;
  path_ = object.path_;
  key_string_ = object.key_string_;
}